

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O1

int CVodeGetQuadStats(void *cvode_mem,long *nfQevals,long *nQetfails)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x7b1;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x5c) != 0) {
      *nfQevals = *(long *)((long)cvode_mem + 0x638);
      *nQetfails = *(long *)((long)cvode_mem + 0x6b0);
      return 0;
    }
    msgfmt = "Quadrature integration not activated.";
    iVar1 = -0x1e;
    error_code = -0x1e;
    line = 0x7b9;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetQuadStats",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeGetQuadStats(void* cvode_mem, long int* nfQevals, long int* nQetfails)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_quadr == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUAD, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUAD);
    return (CV_NO_QUAD);
  }

  *nfQevals  = cv_mem->cv_nfQe;
  *nQetfails = cv_mem->cv_netfQ;

  return (CV_SUCCESS);
}